

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

ElseClauseSyntax * __thiscall slang::parsing::Parser::parseElseClause(Parser *this)

{
  bool bVar1;
  StatementSyntax *clause;
  ElseClauseSyntax *pEVar2;
  Token elseKeyword;
  SourceRange range;
  Token tok;
  Token local_38;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
  if (bVar1) {
    elseKeyword = ParserBase::consume(&this->super_ParserBase);
    clause = parseStatement(this,true,false);
    if ((clause->super_SyntaxNode).kind == ConditionalStatement) {
      local_38._0_8_ = *(undefined8 *)&clause[1].super_SyntaxNode;
      local_38.info = (Info *)clause[1].super_SyntaxNode.parent;
      if ((SyntaxNode *)local_38.info != (SyntaxNode *)0x0) {
        range = Token::range(&local_38);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbb0005,range);
      }
    }
    pEVar2 = slang::syntax::SyntaxFactory::elseClause
                       (&this->factory,elseKeyword,&clause->super_SyntaxNode);
  }
  else {
    pEVar2 = (ElseClauseSyntax *)0x0;
  }
  return pEVar2;
}

Assistant:

ElseClauseSyntax* Parser::parseElseClause() {
    if (peek(TokenKind::ElseKeyword)) {
        auto elseKeyword = consume();
        auto& stmt = parseStatement();
        if (stmt.kind == SyntaxKind::ConditionalStatement) {
            if (auto tok = stmt.as<ConditionalStatementSyntax>().uniqueOrPriority)
                addDiag(diag::UniquePriorityAfterElse, tok.range());
        }
        return &factory.elseClause(elseKeyword, stmt);
    }
    return nullptr;
}